

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utSortByPType.cpp
# Opt level: O0

void __thiscall
SortByPTypeProcessTest_SortByPTypeStep_Test::TestBody
          (SortByPTypeProcessTest_SortByPTypeStep_Test *this)

{
  uint uVar1;
  SortByPTypeProcess *pSVar2;
  bool bVar3;
  char *pcVar4;
  char *in_R9;
  bool local_3e2;
  bool local_3e1;
  aiPrimitiveType local_36c;
  string local_328;
  AssertHelper local_308;
  Message local_300;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__8;
  aiFace *face;
  undefined1 local_2d0 [4];
  uint f;
  AssertHelper local_2b0;
  Message local_2a8;
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_268;
  Message local_260;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_220;
  Message local_218;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1d8;
  Message local_1d0;
  bool local_1c1;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_190;
  Message local_188;
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__2;
  Message local_118;
  aiPrimitiveType local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__1;
  aiMesh *mesh;
  AssertHelper local_88;
  Message local_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  uint n;
  uint real;
  uint m_1;
  uint idx;
  Message local_48 [3];
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  uint m;
  ScenePreprocessor s;
  SortByPTypeProcessTest_SortByPTypeStep_Test *this_local;
  
  s.scene = (aiScene *)this;
  Assimp::ScenePreprocessor::ScenePreprocessor
            ((ScenePreprocessor *)&stack0xffffffffffffffe8,
             (this->super_SortByPTypeProcessTest).mScene);
  Assimp::ScenePreprocessor::ProcessScene((ScenePreprocessor *)&stack0xffffffffffffffe8);
  for (gtest_ar.message_.ptr_._4_4_ = 0; gtest_ar.message_.ptr_._4_4_ < 10;
      gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_30,"result[m]","mScene->mMeshes[m]->mPrimitiveTypes",
               ::result + gtest_ar.message_.ptr_._4_4_,
               &((this->super_SortByPTypeProcessTest).mScene)->mMeshes[gtest_ar.message_.ptr_._4_4_]
                ->mPrimitiveTypes);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
    if (!bVar3) {
      testing::Message::Message(local_48);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&m_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                 ,0xb3,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&m_1,local_48);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m_1);
      testing::Message::~Message(local_48);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  }
  pSVar2 = (this->super_SortByPTypeProcessTest).mProcess1;
  (*(pSVar2->super_BaseProcess)._vptr_BaseProcess[5])
            (pSVar2,(this->super_SortByPTypeProcessTest).mScene);
  gtest_ar_.message_.ptr_._4_4_ = 0;
  for (n = 0; n < 10; n = n + 1) {
    for (gtest_ar_.message_.ptr_._0_4_ = 0; (uint)gtest_ar_.message_.ptr_ < 4;
        gtest_ar_.message_.ptr_._0_4_ = (uint)gtest_ar_.message_.ptr_ + 1) {
      uVar1 = ::num[n][(uint)gtest_ar_.message_.ptr_];
      if (uVar1 != 0) {
        local_71 = gtest_ar_.message_.ptr_._4_4_ <
                   ((this->super_SortByPTypeProcessTest).mScene)->mNumMeshes;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_70,&local_71,(type *)0x0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
        if (!bVar3) {
          testing::Message::Message(&local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&mesh,(internal *)local_70,
                     (AssertionResult *)"real < mScene->mNumMeshes","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xbb,pcVar4);
          testing::internal::AssertHelper::operator=(&local_88,&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          std::__cxx11::string::~string((string *)&mesh);
          testing::Message::~Message(&local_80);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
        gtest_ar__1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((this->super_SortByPTypeProcessTest).mScene)->mMeshes[gtest_ar_.message_.ptr_._4_4_];
        local_c1 = (aiMesh *)gtest_ar__1.message_.ptr_ != (aiMesh *)0x0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_c0,&local_c1,(type *)0x0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
        if (!bVar3) {
          testing::Message::Message(&local_d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_1.message_,(internal *)local_c0,
                     (AssertionResult *)"NULL != mesh","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xbf,pcVar4);
          testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_d8);
          std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
        if ((uint)gtest_ar_.message_.ptr_ + 1 < 4) {
          local_36c = 1 << ((byte)(uint)gtest_ar_.message_.ptr_ & 0x1f);
        }
        else {
          local_36c = aiPrimitiveType_POLYGON;
        }
        local_10c = local_36c;
        testing::internal::EqHelper<false>::Compare<aiPrimitiveType,unsigned_int>
                  ((EqHelper<false> *)local_108,
                   "((n+1) > 3 ? aiPrimitiveType_POLYGON : (aiPrimitiveType)(1u << ((n+1)-1)))",
                   "mesh->mPrimitiveTypes",&local_10c,(uint *)gtest_ar__1.message_.ptr_);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
        if (!bVar3) {
          testing::Message::Message(&local_118);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xc0,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__2.message_,&local_118);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
          testing::Message::~Message(&local_118);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
        local_131 = ((gtest_ar__1.message_.ptr_)->field_2)._M_allocated_capacity != 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_130,&local_131,(type *)0x0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
        if (!bVar3) {
          testing::Message::Message(&local_140);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__3.message_,(internal *)local_130,
                     (AssertionResult *)"NULL != mesh->mVertices","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_148,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xc1,pcVar4);
          testing::internal::AssertHelper::operator=(&local_148,&local_140);
          testing::internal::AssertHelper::~AssertHelper(&local_148);
          std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_140);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
        local_179 = *(long *)((long)&(gtest_ar__1.message_.ptr_)->field_2 + 8) != 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_178,&local_179,(type *)0x0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
        if (!bVar3) {
          testing::Message::Message(&local_188);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_178,
                     (AssertionResult *)"NULL != mesh->mNormals","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_190,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xc2,pcVar4);
          testing::internal::AssertHelper::operator=(&local_190,&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_190);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_188);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
        local_1c1 = *(long *)(gtest_ar__1.message_.ptr_ + 1) != 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1c0,&local_1c1,(type *)0x0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
        if (!bVar3) {
          testing::Message::Message(&local_1d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_1c0,
                     (AssertionResult *)"NULL != mesh->mTangents","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xc3,pcVar4);
          testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
          testing::internal::AssertHelper::~AssertHelper(&local_1d8);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_1d0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
        local_209 = gtest_ar__1.message_.ptr_[1]._M_string_length != 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_208,&local_209,(type *)0x0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
        if (!bVar3) {
          testing::Message::Message(&local_218);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__6.message_,(internal *)local_208,
                     (AssertionResult *)"NULL != mesh->mBitangents","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_220,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xc4,pcVar4);
          testing::internal::AssertHelper::operator=(&local_220,&local_218);
          testing::internal::AssertHelper::~AssertHelper(&local_220);
          std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
          testing::Message::~Message(&local_218);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
        local_251 = gtest_ar__1.message_.ptr_[3].field_2._M_allocated_capacity != 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_250,&local_251,(type *)0x0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
        if (!bVar3) {
          testing::Message::Message(&local_260);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__7.message_,(internal *)local_250,
                     (AssertionResult *)"NULL != mesh->mTextureCoords[0]","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_268,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,0xc5,pcVar4);
          testing::internal::AssertHelper::operator=(&local_268,&local_260);
          testing::internal::AssertHelper::~AssertHelper(&local_268);
          std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
          testing::Message::~Message(&local_260);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
        local_299 = (uint)(gtest_ar__1.message_.ptr_)->_M_string_length == uVar1;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_298,&local_299,(type *)0x0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
        if (!bVar3) {
          testing::Message::Message(&local_2a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_2d0,(internal *)local_298,
                     (AssertionResult *)"mesh->mNumFaces == idx","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2b0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                     ,199,pcVar4);
          testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
          testing::internal::AssertHelper::~AssertHelper(&local_2b0);
          std::__cxx11::string::~string((string *)local_2d0);
          testing::Message::~Message(&local_2a8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
        for (face._4_4_ = 0; face._4_4_ < (uint)(gtest_ar__1.message_.ptr_)->_M_string_length;
            face._4_4_ = face._4_4_ + 1) {
          gtest_ar__8.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (gtest_ar__1.message_.ptr_[6].field_2._M_allocated_capacity +
               (ulong)face._4_4_ * 0x10);
          local_3e1 = true;
          if (*(uint *)gtest_ar__8.message_.ptr_ != (uint)gtest_ar_.message_.ptr_ + 1) {
            local_3e2 = false;
            if ((uint)gtest_ar_.message_.ptr_ == 3) {
              local_3e2 = 3 < *(uint *)gtest_ar__8.message_.ptr_;
            }
            local_3e1 = local_3e2;
          }
          local_2f1 = local_3e1;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
          if (!bVar3) {
            testing::Message::Message(&local_300);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_328,(internal *)local_2f0,
                       (AssertionResult *)
                       "face.mNumIndices == (n+1) || (3 == n && face.mNumIndices > 3)","false",
                       "true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_308,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utSortByPType.cpp"
                       ,0xca,pcVar4);
            testing::internal::AssertHelper::operator=(&local_308,&local_300);
            testing::internal::AssertHelper::~AssertHelper(&local_308);
            std::__cxx11::string::~string((string *)&local_328);
            testing::Message::~Message(&local_300);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
        }
        gtest_ar_.message_.ptr_._4_4_ = gtest_ar_.message_.ptr_._4_4_ + 1;
      }
    }
  }
  return;
}

Assistant:

TEST_F(SortByPTypeProcessTest, SortByPTypeStep) {
    ScenePreprocessor s(mScene);
    s.ProcessScene();
    for (unsigned int m = 0; m< 10;++m)
        EXPECT_EQ(result[m], mScene->mMeshes[m]->mPrimitiveTypes);

    mProcess1->Execute(mScene);

    unsigned int idx = 0;
    for (unsigned int m = 0,real = 0; m< 10;++m) {
        for (unsigned int n = 0; n < 4;++n) {
            if ((idx = num[m][n])) {
                EXPECT_TRUE(real < mScene->mNumMeshes);

                aiMesh* mesh = mScene->mMeshes[real];

                EXPECT_TRUE(NULL != mesh);
                EXPECT_EQ(AI_PRIMITIVE_TYPE_FOR_N_INDICES(n+1), mesh->mPrimitiveTypes);
                EXPECT_TRUE(NULL != mesh->mVertices);
                EXPECT_TRUE(NULL != mesh->mNormals);
                EXPECT_TRUE(NULL != mesh->mTangents);
                EXPECT_TRUE(NULL != mesh->mBitangents);
                EXPECT_TRUE(NULL != mesh->mTextureCoords[0]);

                EXPECT_TRUE(mesh->mNumFaces == idx);
                for (unsigned int f = 0; f < mesh->mNumFaces;++f) {
                    aiFace& face = mesh->mFaces[f];
                    EXPECT_TRUE(face.mNumIndices == (n+1) || (3 == n && face.mNumIndices > 3));
                }
                ++real;
            }
        }
    }
}